

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O1

void __thiscall lzham::lzcompressor::state::reset(state *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar9;
  
  (this->super_state_base).m_cur_ofs = 0;
  (this->super_state_base).m_cur_state = 0;
  this->m_block_start_dict_ofs = 0;
  auVar1 = _DAT_00111040;
  lVar2 = 0;
  auVar3 = _DAT_00111020;
  auVar10 = _DAT_00111030;
  do {
    if (SUB164(auVar10 ^ auVar1,4) == -0x80000000 && SUB164(auVar10 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_match_model[lVar2].m_bit_0_prob = 0x400;
      this->m_is_match_model[lVar2 + 1].m_bit_0_prob = 0x400;
    }
    if (SUB164(auVar3 ^ auVar1,4) == -0x80000000 && SUB164(auVar3 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_match_model[lVar2 + 2].m_bit_0_prob = 0x400;
      this->m_is_match_model[lVar2 + 3].m_bit_0_prob = 0x400;
    }
    lVar2 = lVar2 + 4;
    lVar9 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 4;
    auVar10._8_8_ = lVar9 + 4;
    lVar9 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 4;
    auVar3._8_8_ = lVar9 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  auVar4 = _DAT_00111020;
  auVar11 = _DAT_00111030;
  do {
    if (SUB164(auVar11 ^ auVar1,4) == -0x80000000 && SUB164(auVar11 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_rep_model[lVar2].m_bit_0_prob = 0x400;
      this->m_is_rep_model[lVar2 + 1].m_bit_0_prob = 0x400;
    }
    if (SUB164(auVar4 ^ auVar1,4) == -0x80000000 && SUB164(auVar4 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_rep_model[lVar2 + 2].m_bit_0_prob = 0x400;
      this->m_is_rep_model[lVar2 + 3].m_bit_0_prob = 0x400;
    }
    lVar2 = lVar2 + 4;
    lVar9 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 4;
    auVar11._8_8_ = lVar9 + 4;
    lVar9 = auVar4._8_8_;
    auVar4._0_8_ = auVar4._0_8_ + 4;
    auVar4._8_8_ = lVar9 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  auVar5 = _DAT_00111020;
  auVar12 = _DAT_00111030;
  do {
    if (SUB164(auVar12 ^ auVar1,4) == -0x80000000 && SUB164(auVar12 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_rep0_model[lVar2].m_bit_0_prob = 0x400;
      this->m_is_rep0_model[lVar2 + 1].m_bit_0_prob = 0x400;
    }
    if (SUB164(auVar5 ^ auVar1,4) == -0x80000000 && SUB164(auVar5 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_rep0_model[lVar2 + 2].m_bit_0_prob = 0x400;
      this->m_is_rep0_model[lVar2 + 3].m_bit_0_prob = 0x400;
    }
    lVar2 = lVar2 + 4;
    lVar9 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 4;
    auVar12._8_8_ = lVar9 + 4;
    lVar9 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 4;
    auVar5._8_8_ = lVar9 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  auVar6 = _DAT_00111020;
  auVar13 = _DAT_00111030;
  do {
    if (SUB164(auVar13 ^ auVar1,4) == -0x80000000 && SUB164(auVar13 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_rep0_single_byte_model[lVar2].m_bit_0_prob = 0x400;
      this->m_is_rep0_single_byte_model[lVar2 + 1].m_bit_0_prob = 0x400;
    }
    if (SUB164(auVar6 ^ auVar1,4) == -0x80000000 && SUB164(auVar6 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_rep0_single_byte_model[lVar2 + 2].m_bit_0_prob = 0x400;
      this->m_is_rep0_single_byte_model[lVar2 + 3].m_bit_0_prob = 0x400;
    }
    lVar2 = lVar2 + 4;
    lVar9 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 4;
    auVar13._8_8_ = lVar9 + 4;
    lVar9 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 4;
    auVar6._8_8_ = lVar9 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  auVar7 = _DAT_00111020;
  auVar14 = _DAT_00111030;
  do {
    if (SUB164(auVar14 ^ auVar1,4) == -0x80000000 && SUB164(auVar14 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_rep1_model[lVar2].m_bit_0_prob = 0x400;
      this->m_is_rep1_model[lVar2 + 1].m_bit_0_prob = 0x400;
    }
    if (SUB164(auVar7 ^ auVar1,4) == -0x80000000 && SUB164(auVar7 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_rep1_model[lVar2 + 2].m_bit_0_prob = 0x400;
      this->m_is_rep1_model[lVar2 + 3].m_bit_0_prob = 0x400;
    }
    lVar2 = lVar2 + 4;
    lVar9 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 4;
    auVar14._8_8_ = lVar9 + 4;
    lVar9 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 4;
    auVar7._8_8_ = lVar9 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 0;
  auVar8 = _DAT_00111020;
  auVar15 = _DAT_00111030;
  do {
    if (SUB164(auVar15 ^ auVar1,4) == -0x80000000 && SUB164(auVar15 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_rep2_model[lVar2].m_bit_0_prob = 0x400;
      this->m_is_rep2_model[lVar2 + 1].m_bit_0_prob = 0x400;
    }
    if (SUB164(auVar8 ^ auVar1,4) == -0x80000000 && SUB164(auVar8 ^ auVar1,0) < -0x7ffffff4) {
      this->m_is_rep2_model[lVar2 + 2].m_bit_0_prob = 0x400;
      this->m_is_rep2_model[lVar2 + 3].m_bit_0_prob = 0x400;
    }
    lVar2 = lVar2 + 4;
    lVar9 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + 4;
    auVar15._8_8_ = lVar9 + 4;
    lVar9 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 4;
    auVar8._8_8_ = lVar9 + 4;
  } while (lVar2 != 0xc);
  lVar2 = 1;
  do {
    lzham::quasi_adaptive_huffman_data_model::reset();
    lzham::quasi_adaptive_huffman_data_model::reset();
    lVar2 = lVar2 + -1;
  } while (lVar2 == 0);
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  lzham::quasi_adaptive_huffman_data_model::reset();
  (this->super_state_base).m_match_hist[0] = 1;
  (this->super_state_base).m_match_hist[1] = 1;
  (this->super_state_base).m_match_hist[2] = 1;
  (this->super_state_base).m_match_hist[3] = 1;
  return;
}

Assistant:

void lzcompressor::state::reset()
   {
      m_cur_ofs = 0;
      m_cur_state = 0;
      m_block_start_dict_ofs = 0;

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_match_model); i++) 
         m_is_match_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep_model); i++) 
         m_is_rep_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep0_model); i++) 
         m_is_rep0_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep0_single_byte_model); i++) 
         m_is_rep0_single_byte_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep1_model); i++) 
         m_is_rep1_model[i].clear();
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_rep2_model); i++) 
         m_is_rep2_model[i].clear();
      
      for (uint i = 0; i < 2; i++)
      {
         m_rep_len_table[i].reset();
         m_large_len_table[i].reset();
      }
      m_main_table.reset();
      m_dist_lsb_table.reset();

      m_lit_table.reset();
      m_delta_lit_table.reset();
      
      m_match_hist[0] = 1;
      m_match_hist[1] = 1;
      m_match_hist[2] = 1;
      m_match_hist[3] = 1;
   }